

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

longdouble * trng::math::detail::mln1p<long_double>(longdouble *__return_storage_ptr__,longdouble x)

{
  int n;
  uint uVar1;
  longdouble *plVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  
  if ((longdouble)0.03125 <= ABS(x)) {
    plVar2 = (longdouble *)log1pl();
  }
  else {
    lVar5 = (longdouble)1;
    plVar2 = (longdouble *)0x2;
    lVar6 = (longdouble)0;
    lVar3 = x;
    do {
      lVar3 = lVar3 * x;
      lVar4 = (lVar5 * lVar3) / (longdouble)(int)plVar2;
      lVar6 = lVar6 + lVar4;
      if (ABS(lVar4) < lVar6 * (longdouble)4.3368087e-19) {
        return plVar2;
      }
      lVar5 = -lVar5;
      uVar1 = (int)plVar2 + 1;
      plVar2 = (longdouble *)(ulong)uVar1;
    } while (uVar1 != 0x40);
  }
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }